

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int cmCTest::GetTestModelFromString(char *str)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  string rstr;
  string local_60;
  string local_40;
  
  if (str == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    sVar2 = strlen(str);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,str,str + sVar2);
    cmsys::SystemTools::LowerCase(&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    iVar1 = strncmp(local_40._M_dataplus._M_p,"cont",4);
    if (iVar1 == 0) {
      uVar3 = 2;
    }
    else {
      iVar1 = strncmp(local_40._M_dataplus._M_p,"nigh",4);
      uVar3 = (uint)(iVar1 == 0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return uVar3;
}

Assistant:

int cmCTest::GetTestModelFromString(const char* str)
{
  if (!str) {
    return cmCTest::EXPERIMENTAL;
  }
  std::string rstr = cmSystemTools::LowerCase(str);
  if (cmHasLiteralPrefix(rstr, "cont")) {
    return cmCTest::CONTINUOUS;
  }
  if (cmHasLiteralPrefix(rstr, "nigh")) {
    return cmCTest::NIGHTLY;
  }
  return cmCTest::EXPERIMENTAL;
}